

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  uint local_20;
  int m;
  int scan_local;
  stbi__jpeg *z_local;
  
  z->marker = 0xff;
  sVar1 = stbi__get_marker(z);
  if (sVar1 == 0xd8) {
    if (scan == 1) {
      z_local._4_4_ = 1;
    }
    else {
      bVar2 = stbi__get_marker(z);
      local_20 = (uint)bVar2;
      while( true ) {
        bVar4 = true;
        if ((local_20 != 0xc0) && (bVar4 = true, local_20 != 0xc1)) {
          bVar4 = local_20 == 0xc2;
        }
        if (bVar4) {
          z->progressive = (uint)(local_20 == 0xc2);
          iVar3 = stbi__process_frame_header(z,scan);
          if (iVar3 == 0) {
            return 0;
          }
          return 1;
        }
        iVar3 = stbi__process_marker(z,local_20);
        if (iVar3 == 0) break;
        bVar2 = stbi__get_marker(z);
        while (local_20 = (uint)bVar2, local_20 == 0xff) {
          iVar3 = stbi__at_eof(z->s);
          if (iVar3 != 0) {
            iVar3 = stbi__err("no SOF");
            return iVar3;
          }
          bVar2 = stbi__get_marker(z);
        }
      }
      z_local._4_4_ = 0;
    }
  }
  else {
    z_local._4_4_ = stbi__err("no SOI");
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}